

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
::
emplace_decomposable_with_hash<phmap::priv::NonStandardLayout,std::piecewise_construct_t_const&,std::tuple<phmap::priv::NonStandardLayout_const&&>,std::tuple<int&&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
          *this,NonStandardLayout *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_phmap::priv::NonStandardLayout_&&> *args_1,tuple<int_&&> *args_2)

{
  Inner *this_00;
  ctrl_t *pcVar1;
  slot_type *psVar2;
  size_t sVar3;
  long lVar4;
  size_t i;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *this_01;
  bool bVar5;
  UniqueLock m;
  WriteLock local_40;
  
  lVar4 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)hashval >> 8 ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x70;
  this_00 = (Inner *)(this + lVar4);
  this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)(this + lVar4 + 0x28);
  local_40.m_ = (mutex_type *)this_00;
  std::mutex::lock((mutex *)this_00);
  local_40.locked_ = true;
  i = raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::_find_key<phmap::priv::NonStandardLayout>(this_01,key,hashval);
  bVar5 = i == 0xffffffffffffffff;
  if (bVar5) {
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ::prepare_insert(this_01,hashval);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<phmap::priv::NonStandardLayout_const&&>,std::tuple<int&&>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
                *)this_01,i,args,args_1,args_2);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
    ::set_ctrl(this_01,i,(byte)hashval & 0x7f);
  }
  pcVar1 = (this_00->set_).ctrl_;
  psVar2 = (this_00->set_).slots_;
  sVar3 = (this_00->set_).capacity_;
  (__return_storage_ptr__->first).inner_ = this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x700);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar1 + i;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar2 + i;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar1 + sVar3;
  __return_storage_ptr__->second = bVar5;
  LockableBaseImpl<std::mutex>::WriteLock::~WriteLock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }